

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASBase.cpp
# Opt level: O0

void Diligent::ValidateBottomLevelASDesc(BottomLevelASDesc *Desc)

{
  RAYTRACING_BUILD_AS_FLAGS RVar1;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  BLASBoundingBoxDesc *local_e0;
  BLASBoundingBoxDesc *box;
  Char *pCStack_d0;
  Uint32 i_1;
  char *local_c8;
  uint local_bc;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  uint local_9c;
  char *local_98;
  Char *local_90;
  char *local_88;
  char *local_80;
  BLASTriangleDesc *local_78;
  BLASTriangleDesc *tri;
  char *pcStack_68;
  Uint32 i;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  BottomLevelASDesc *local_38;
  BottomLevelASDesc *Desc_local;
  
  local_38 = Desc;
  if (Desc->CompactedSize == 0) {
    if ((Desc->BoxCount != 0) == (Desc->TriangleCount != 0)) {
      if ((Desc->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_108 = "";
      }
      else {
        local_108 = (Desc->super_DeviceObjectAttribs).Name;
      }
      local_50 = local_108;
      LogError<true,char[35],char_const*,char[15],char[26],unsigned_int,char[22],unsigned_int,char[20]>
                (false,"ValidateBottomLevelASDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                 ,0x30,(char (*) [35])"Description of a bottom-level AS \'",&local_50,
                 (char (*) [15])"\' is invalid: ",(char (*) [26])"Exactly one of BoxCount (",
                 &Desc->BoxCount,(char (*) [22])") and TriangleCount (",&Desc->TriangleCount,
                 (char (*) [20])") must be non-zero.");
    }
    if ((local_38->pBoxes == (BLASBoundingBoxDesc *)0x0) && (local_38->BoxCount != 0)) {
      if ((local_38->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_110 = "";
      }
      else {
        local_110 = (local_38->super_DeviceObjectAttribs).Name;
      }
      local_58 = local_110;
      LogError<true,char[35],char_const*,char[15],char[13],unsigned_int,char[22]>
                (false,"ValidateBottomLevelASDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                 ,0x33,(char (*) [35])"Description of a bottom-level AS \'",&local_58,
                 (char (*) [15])"\' is invalid: ",(char (*) [13])"BoxCount is ",&local_38->BoxCount,
                 (char (*) [22])", but pBoxes is null.");
    }
    if ((local_38->pTriangles == (BLASTriangleDesc *)0x0) && (local_38->TriangleCount != 0)) {
      if ((local_38->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_118 = "";
      }
      else {
        local_118 = (local_38->super_DeviceObjectAttribs).Name;
      }
      local_60 = local_118;
      LogError<true,char[35],char_const*,char[15],char[18],unsigned_int,char[26]>
                (false,"ValidateBottomLevelASDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                 ,0x36,(char (*) [35])"Description of a bottom-level AS \'",&local_60,
                 (char (*) [15])"\' is invalid: ",(char (*) [18])"TriangleCount is ",
                 &local_38->TriangleCount,(char (*) [26])", but pTriangles is null.");
    }
    RVar1 = operator&(local_38->Flags,RAYTRACING_BUILD_AS_PREFER_FAST_TRACE);
    if ((RVar1 != RAYTRACING_BUILD_AS_NONE) &&
       (RVar1 = operator&(local_38->Flags,RAYTRACING_BUILD_AS_PREFER_FAST_BUILD),
       RVar1 != RAYTRACING_BUILD_AS_NONE)) {
      if ((local_38->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_120 = "";
      }
      else {
        local_120 = (local_38->super_DeviceObjectAttribs).Name;
      }
      pcStack_68 = local_120;
      LogError<true,char[35],char_const*,char[15],char[110]>
                (false,"ValidateBottomLevelASDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                 ,0x39,(char (*) [35])"Description of a bottom-level AS \'",&stack0xffffffffffffff98
                 ,(char (*) [15])"\' is invalid: ",
                 (char (*) [110])
                 "RAYTRACING_BUILD_AS_PREFER_FAST_TRACE and RAYTRACING_BUILD_AS_PREFER_FAST_BUILD flags are mutually exclusive."
                );
    }
    for (tri._4_4_ = 0; tri._4_4_ < local_38->TriangleCount; tri._4_4_ = tri._4_4_ + 1) {
      local_78 = local_38->pTriangles + tri._4_4_;
      if (local_78->GeometryName == (Char *)0x0) {
        if ((local_38->super_DeviceObjectAttribs).Name == (Char *)0x0) {
          local_128 = "";
        }
        else {
          local_128 = (local_38->super_DeviceObjectAttribs).Name;
        }
        local_80 = local_128;
        LogError<true,char[35],char_const*,char[15],char[12],unsigned_int,char[33]>
                  (false,"ValidateBottomLevelASDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                   ,0x40,(char (*) [35])"Description of a bottom-level AS \'",&local_80,
                   (char (*) [15])"\' is invalid: ",(char (*) [12])0xc084ab,(uint *)((long)&tri + 4)
                   ,(char (*) [33])"].GeometryName must not be null.");
      }
      if (((local_78->VertexValueType != VT_FLOAT32) && (local_78->VertexValueType != VT_FLOAT16))
         && (local_78->VertexValueType != VT_INT16)) {
        if ((local_38->super_DeviceObjectAttribs).Name == (Char *)0x0) {
          local_130 = "";
        }
        else {
          local_130 = (local_38->super_DeviceObjectAttribs).Name;
        }
        local_88 = local_130;
        local_90 = GetValueTypeString(local_78->VertexValueType);
        LogError<true,char[35],char_const*,char[15],char[12],unsigned_int,char[20],char_const*,char[87]>
                  (false,"ValidateBottomLevelASDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                   ,0x44,(char (*) [35])"Description of a bottom-level AS \'",&local_88,
                   (char (*) [15])"\' is invalid: ",(char (*) [12])0xc084ab,(uint *)((long)&tri + 4)
                   ,(char (*) [20])"].VertexValueType (",&local_90,
                   (char (*) [87])
                   ") is invalid. Only the following values are allowed: VT_FLOAT32, VT_FLOAT16, VT_INT16."
                  );
      }
      if ((local_78->VertexComponentCount != '\x02') && (local_78->VertexComponentCount != '\x03'))
      {
        if ((local_38->super_DeviceObjectAttribs).Name == (Char *)0x0) {
          local_138 = "";
        }
        else {
          local_138 = (local_38->super_DeviceObjectAttribs).Name;
        }
        local_98 = local_138;
        local_9c = (uint)local_78->VertexComponentCount;
        LogError<true,char[35],char_const*,char[15],char[12],unsigned_int,char[25],unsigned_int,char[39]>
                  (false,"ValidateBottomLevelASDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                   ,0x47,(char (*) [35])"Description of a bottom-level AS \'",&local_98,
                   (char (*) [15])"\' is invalid: ",(char (*) [12])0xc084ab,(uint *)((long)&tri + 4)
                   ,(char (*) [25])"].VertexComponentCount (",&local_9c,
                   (char (*) [39])") is invalid. Only 2 or 3 are allowed.");
      }
      if (local_78->MaxVertexCount == 0) {
        if ((local_38->super_DeviceObjectAttribs).Name == (Char *)0x0) {
          local_140 = "";
        }
        else {
          local_140 = (local_38->super_DeviceObjectAttribs).Name;
        }
        local_a8 = local_140;
        LogError<true,char[35],char_const*,char[15],char[12],unsigned_int,char[41]>
                  (false,"ValidateBottomLevelASDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                   ,0x4a,(char (*) [35])"Description of a bottom-level AS \'",&local_a8,
                   (char (*) [15])"\' is invalid: ",(char (*) [12])0xc084ab,(uint *)((long)&tri + 4)
                   ,(char (*) [41])"].MaxVertexCount must be greater than 0.");
      }
      if (local_78->MaxPrimitiveCount == 0) {
        if ((local_38->super_DeviceObjectAttribs).Name == (Char *)0x0) {
          local_148 = "";
        }
        else {
          local_148 = (local_38->super_DeviceObjectAttribs).Name;
        }
        local_b0 = local_148;
        LogError<true,char[35],char_const*,char[15],char[12],unsigned_int,char[44]>
                  (false,"ValidateBottomLevelASDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                   ,0x4d,(char (*) [35])"Description of a bottom-level AS \'",&local_b0,
                   (char (*) [15])"\' is invalid: ",(char (*) [12])0xc084ab,(uint *)((long)&tri + 4)
                   ,(char (*) [44])"].MaxPrimitiveCount must be greater than 0.");
      }
      if (local_78->IndexType == VT_UNDEFINED) {
        if (local_78->MaxVertexCount != local_78->MaxPrimitiveCount * 3) {
          if ((local_38->super_DeviceObjectAttribs).Name == (Char *)0x0) {
            local_150 = "";
          }
          else {
            local_150 = (local_38->super_DeviceObjectAttribs).Name;
          }
          local_b8 = local_150;
          local_bc = local_78->MaxPrimitiveCount * 3;
          LogError<true,char[35],char_const*,char[15],char[12],unsigned_int,char[19],unsigned_int,char[43],unsigned_int,char[3]>
                    (false,"ValidateBottomLevelASDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                     ,0x53,(char (*) [35])"Description of a bottom-level AS \'",&local_b8,
                     (char (*) [15])"\' is invalid: ",(char (*) [12])0xc084ab,
                     (uint *)((long)&tri + 4),(char (*) [19])"].MaxVertexCount (",
                     &local_78->MaxVertexCount,
                     (char (*) [43])") must be equal to MaxPrimitiveCount * 3 (",&local_bc,
                     (char (*) [3])0xccce78);
        }
      }
      else if ((local_78->IndexType != VT_UINT32) && (local_78->IndexType != VT_UINT16)) {
        if ((local_38->super_DeviceObjectAttribs).Name == (Char *)0x0) {
          local_158 = "";
        }
        else {
          local_158 = (local_38->super_DeviceObjectAttribs).Name;
        }
        local_c8 = local_158;
        pCStack_d0 = GetValueTypeString(local_78->VertexValueType);
        LogError<true,char[35],char_const*,char[15],char[12],unsigned_int,char[14],char_const*,char[34]>
                  (false,"ValidateBottomLevelASDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                   ,0x59,(char (*) [35])"Description of a bottom-level AS \'",&local_c8,
                   (char (*) [15])"\' is invalid: ",(char (*) [12])0xc084ab,(uint *)((long)&tri + 4)
                   ,(char (*) [14])"].IndexType (",&stack0xffffffffffffff30,
                   (char (*) [34])") must be VT_UINT16 or VT_UINT32.");
      }
    }
    for (box._4_4_ = 0; box._4_4_ < local_38->BoxCount; box._4_4_ = box._4_4_ + 1) {
      local_e0 = local_38->pBoxes + box._4_4_;
      if (local_e0->GeometryName == (Char *)0x0) {
        if ((local_38->super_DeviceObjectAttribs).Name == (Char *)0x0) {
          local_160 = "";
        }
        else {
          local_160 = (local_38->super_DeviceObjectAttribs).Name;
        }
        local_e8 = local_160;
        LogError<true,char[35],char_const*,char[15],char[8],unsigned_int,char[33]>
                  (false,"ValidateBottomLevelASDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                   ,0x62,(char (*) [35])"Description of a bottom-level AS \'",&local_e8,
                   (char (*) [15])"\' is invalid: ",(char (*) [8])0xcc40aa,(uint *)((long)&box + 4),
                   (char (*) [33])"].GeometryName must not be null.");
      }
      if (local_e0->MaxBoxCount == 0) {
        if ((local_38->super_DeviceObjectAttribs).Name == (Char *)0x0) {
          local_168 = "";
        }
        else {
          local_168 = (local_38->super_DeviceObjectAttribs).Name;
        }
        local_f0 = local_168;
        LogError<true,char[35],char_const*,char[15],char[8],unsigned_int,char[38]>
                  (false,"ValidateBottomLevelASDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                   ,0x65,(char (*) [35])"Description of a bottom-level AS \'",&local_f0,
                   (char (*) [15])"\' is invalid: ",(char (*) [8])0xcc40aa,(uint *)((long)&box + 4),
                   (char (*) [38])"].MaxBoxCount must be greater than 0.");
      }
    }
  }
  else {
    if ((Desc->pTriangles != (BLASTriangleDesc *)0x0) ||
       (Desc->pBoxes != (BLASBoundingBoxDesc *)0x0)) {
      if ((Desc->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_f8 = "";
      }
      else {
        local_f8 = (Desc->super_DeviceObjectAttribs).Name;
      }
      local_40 = local_f8;
      LogError<true,char[35],char_const*,char[15],char[81]>
                (false,"ValidateBottomLevelASDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                 ,0x28,(char (*) [35])"Description of a bottom-level AS \'",&local_40,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [81])
                 "If non-zero CompactedSize is specified, pTriangles and pBoxes must both be null.")
      ;
    }
    if (local_38->Flags != RAYTRACING_BUILD_AS_NONE) {
      if ((local_38->super_DeviceObjectAttribs).Name == (Char *)0x0) {
        local_100 = "";
      }
      else {
        local_100 = (local_38->super_DeviceObjectAttribs).Name;
      }
      local_48 = local_100;
      LogError<true,char[35],char_const*,char[15],char[80]>
                (false,"ValidateBottomLevelASDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                 ,0x2b,(char (*) [35])"Description of a bottom-level AS \'",&local_48,
                 (char (*) [15])"\' is invalid: ",
                 (char (*) [80])
                 "If non-zero CompactedSize is specified, Flags must be RAYTRACING_BUILD_AS_NONE.");
    }
  }
  return;
}

Assistant:

void ValidateBottomLevelASDesc(const BottomLevelASDesc& Desc) noexcept(false)
{
#define LOG_BLAS_ERROR_AND_THROW(...) LOG_ERROR_AND_THROW("Description of a bottom-level AS '", (Desc.Name ? Desc.Name : ""), "' is invalid: ", ##__VA_ARGS__)

    if (Desc.CompactedSize > 0)
    {
        if (Desc.pTriangles != nullptr || Desc.pBoxes != nullptr)
            LOG_BLAS_ERROR_AND_THROW("If non-zero CompactedSize is specified, pTriangles and pBoxes must both be null.");

        if (Desc.Flags != RAYTRACING_BUILD_AS_NONE)
            LOG_BLAS_ERROR_AND_THROW("If non-zero CompactedSize is specified, Flags must be RAYTRACING_BUILD_AS_NONE.");
    }
    else
    {
        if (!((Desc.BoxCount != 0) ^ (Desc.TriangleCount != 0)))
            LOG_BLAS_ERROR_AND_THROW("Exactly one of BoxCount (", Desc.BoxCount, ") and TriangleCount (", Desc.TriangleCount, ") must be non-zero.");

        if (Desc.pBoxes == nullptr && Desc.BoxCount > 0)
            LOG_BLAS_ERROR_AND_THROW("BoxCount is ", Desc.BoxCount, ", but pBoxes is null.");

        if (Desc.pTriangles == nullptr && Desc.TriangleCount > 0)
            LOG_BLAS_ERROR_AND_THROW("TriangleCount is ", Desc.TriangleCount, ", but pTriangles is null.");

        if ((Desc.Flags & RAYTRACING_BUILD_AS_PREFER_FAST_TRACE) != 0 && (Desc.Flags & RAYTRACING_BUILD_AS_PREFER_FAST_BUILD) != 0)
            LOG_BLAS_ERROR_AND_THROW("RAYTRACING_BUILD_AS_PREFER_FAST_TRACE and RAYTRACING_BUILD_AS_PREFER_FAST_BUILD flags are mutually exclusive.");

        for (Uint32 i = 0; i < Desc.TriangleCount; ++i)
        {
            const BLASTriangleDesc& tri = Desc.pTriangles[i];

            if (tri.GeometryName == nullptr)
                LOG_BLAS_ERROR_AND_THROW("pTriangles[", i, "].GeometryName must not be null.");

            if (tri.VertexValueType != VT_FLOAT32 && tri.VertexValueType != VT_FLOAT16 && tri.VertexValueType != VT_INT16)
                LOG_BLAS_ERROR_AND_THROW("pTriangles[", i, "].VertexValueType (", GetValueTypeString(tri.VertexValueType),
                                         ") is invalid. Only the following values are allowed: VT_FLOAT32, VT_FLOAT16, VT_INT16.");

            if (tri.VertexComponentCount != 2 && tri.VertexComponentCount != 3)
                LOG_BLAS_ERROR_AND_THROW("pTriangles[", i, "].VertexComponentCount (", Uint32{tri.VertexComponentCount}, ") is invalid. Only 2 or 3 are allowed.");

            if (tri.MaxVertexCount == 0)
                LOG_BLAS_ERROR_AND_THROW("pTriangles[", i, "].MaxVertexCount must be greater than 0.");

            if (tri.MaxPrimitiveCount == 0)
                LOG_BLAS_ERROR_AND_THROW("pTriangles[", i, "].MaxPrimitiveCount must be greater than 0.");

            if (tri.IndexType == VT_UNDEFINED)
            {
                if (tri.MaxVertexCount != tri.MaxPrimitiveCount * 3)
                    LOG_BLAS_ERROR_AND_THROW("pTriangles[", i, "].MaxVertexCount (", tri.MaxVertexCount,
                                             ") must be equal to MaxPrimitiveCount * 3 (", tri.MaxPrimitiveCount * 3, ").");
            }
            else
            {
                if (tri.IndexType != VT_UINT32 && tri.IndexType != VT_UINT16)
                    LOG_BLAS_ERROR_AND_THROW("pTriangles[", i, "].IndexType (", GetValueTypeString(tri.VertexValueType),
                                             ") must be VT_UINT16 or VT_UINT32.");
            }
        }

        for (Uint32 i = 0; i < Desc.BoxCount; ++i)
        {
            const BLASBoundingBoxDesc& box = Desc.pBoxes[i];

            if (box.GeometryName == nullptr)
                LOG_BLAS_ERROR_AND_THROW("pBoxes[", i, "].GeometryName must not be null.");

            if (box.MaxBoxCount == 0)
                LOG_BLAS_ERROR_AND_THROW("pBoxes[", i, "].MaxBoxCount must be greater than 0.");
        }
    }

#undef LOG_BLAS_ERROR_AND_THROW
}